

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OrderMatcherTestCase.cpp
# Opt level: O3

void __thiscall TestoverMatch::~TestoverMatch(TestoverMatch *this)

{
  UnitTest::Test::~Test(&this->super_Test);
  operator_delete(this,0x38);
  return;
}

Assistant:

TEST( overMatch )
{
  OrderMatcher object;
  Order order1("1", "LNUX", "OWNER1", "TARGET",
               Order::buy, Order::limit, 12.32, 100);
  Order order2("2", "LNUX", "OWNER2", "TARGET",
               Order::sell, Order::limit, 12.32, 110);
  Order order3("3", "LNUX", "OWNER3", "TARGET",
               Order::buy, Order::limit, 12.32, 100);

  CHECK(object.insert(order1));
  CHECK(object.insert(order2));

  std::queue<Order> orders;
  CHECK(object.match("LNUX", orders));
  CHECK_EQUAL(2U, orders.size());

  Order matchedOrder1 = orders.front();
  orders.pop();
  Order matchedOrder2 = orders.front();
  orders.pop();

  CHECK_EQUAL("1", matchedOrder1.getClientID());
  CHECK(matchedOrder1.isFilled());
  CHECK(matchedOrder1.isClosed());
  CHECK_EQUAL(0, matchedOrder1.getOpenQuantity());
  CHECK_EQUAL(100, matchedOrder1.getExecutedQuantity());
  CHECK_EQUAL(12.32, matchedOrder1.getAvgExecutedPrice());
  CHECK_EQUAL(12.32, matchedOrder1.getLastExecutedPrice());
  CHECK_EQUAL(100, matchedOrder1.getLastExecutedQuantity());

  CHECK_EQUAL("2", matchedOrder2.getClientID());
  CHECK(!matchedOrder2.isFilled());
  CHECK(!matchedOrder2.isClosed());
  CHECK_EQUAL(10, matchedOrder2.getOpenQuantity());
  CHECK_EQUAL(100, matchedOrder2.getExecutedQuantity());
  CHECK_EQUAL(12.32, matchedOrder2.getAvgExecutedPrice());
  CHECK_EQUAL(12.32, matchedOrder2.getLastExecutedPrice());
  CHECK_EQUAL(100, matchedOrder2.getLastExecutedQuantity());

  CHECK(object.insert(order3));
  CHECK(object.match("LNUX", orders));
  CHECK_EQUAL(2U, orders.size());

  Order matchedOrder3 = orders.front();
  orders.pop();
  matchedOrder2 = orders.front();
  orders.pop();

  CHECK_EQUAL("3", matchedOrder3.getClientID());
  CHECK(!matchedOrder3.isFilled());
  CHECK(!matchedOrder3.isClosed());
  CHECK_EQUAL(90, matchedOrder3.getOpenQuantity());
  CHECK_EQUAL(10, matchedOrder3.getExecutedQuantity());
  CHECK_EQUAL(12.32, matchedOrder3.getAvgExecutedPrice());
  CHECK_EQUAL(12.32, matchedOrder3.getLastExecutedPrice());
  CHECK_EQUAL(10, matchedOrder3.getLastExecutedQuantity());

  CHECK_EQUAL("2", matchedOrder2.getClientID());
  CHECK(matchedOrder2.isFilled());
  CHECK(matchedOrder2.isClosed());
  CHECK_EQUAL(0, matchedOrder2.getOpenQuantity());
  CHECK_EQUAL(110, matchedOrder2.getExecutedQuantity());
  CHECK_EQUAL(12.32, matchedOrder2.getAvgExecutedPrice());
  CHECK_EQUAL(12.32, matchedOrder2.getLastExecutedPrice());
  CHECK_EQUAL(10, matchedOrder2.getLastExecutedQuantity());

}